

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int tx_free(wally_tx *tx,_Bool free_parent)

{
  int in_EAX;
  int extraout_EAX;
  long lVar1;
  ulong uVar2;
  
  if (tx != (wally_tx *)0x0) {
    if (tx->num_inputs != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        tx_input_free((wally_tx_input *)(tx->inputs->txhash + lVar1),false);
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0xd0;
      } while (uVar2 < tx->num_inputs);
    }
    clear_and_free(tx->inputs,tx->inputs_allocation_len * 0xd0);
    if (tx->num_outputs != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        tx_output_free((wally_tx_output *)((long)&tx->outputs->satoshi + lVar1),false);
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x70;
      } while (uVar2 < tx->num_outputs);
    }
    clear_and_free(tx->outputs,tx->outputs_allocation_len * 0x70);
    wally_clear(tx,0x38);
    wally_free(tx);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int tx_free(struct wally_tx *tx, bool free_parent)
{
    size_t i;
    if (tx) {
        for (i = 0; i < tx->num_inputs; ++i)
            tx_input_free(&tx->inputs[i], false);
        clear_and_free(tx->inputs, tx->inputs_allocation_len * sizeof(*tx->inputs));
        for (i = 0; i < tx->num_outputs; ++i)
            tx_output_free(&tx->outputs[i], false);
        clear_and_free(tx->outputs, tx->outputs_allocation_len * sizeof(*tx->outputs));
        wally_clear(tx, sizeof(*tx));
        if (free_parent)
            wally_free(tx);
    }
    return WALLY_OK;
}